

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_char_const&>::captureExpression<(Catch::Internal::Operator)0,char>
          (ExpressionLhs<unsigned_char_const&> *this,char *rhs)

{
  ResultBuilder *pRVar1;
  uchar value;
  char in_stack_ffffffffffffff7f;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = ResultBuilder::setResultType
                     (*(ResultBuilder **)this,(uint)**(byte **)(this + 8) == (int)*rhs);
  Catch::toString_abi_cxx11_(&local_38,(Catch *)(ulong)**(byte **)(this + 8),value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Catch::toString_abi_cxx11_(in_stack_ffffffffffffff7f);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  std::__cxx11::string::string((string *)&local_78,"==",&local_79);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }